

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::visit(Executor *this,VariableNode *node)

{
  bool bVar1;
  undefined1 uVar2;
  _Storage<std::reference_wrapper<RuntimeSymbol>,_true> _Var3;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *this_00;
  RuntimeSymbol *pRVar4;
  Executor *this_01;
  Context *pCVar5;
  element_type *peVar6;
  pointer pVVar7;
  reference_wrapper<RuntimeSymbol> *this_02;
  _Optional_payload_base<TypeName> this_03;
  unique_ptr<Function,_std::default_delete<Function>_> *__u;
  shared_ptr<BlockNode> *psVar8;
  int __flags;
  undefined1 uVar9;
  void *__child_stack;
  char *in_RDI;
  void *in_R8;
  optional<std::reference_wrapper<RuntimeSymbol>_> oVar10;
  shared_ptr<BlockNode> body;
  ArgumentsList args;
  TypeName returnType;
  RuntimeFunctionAnalyser functionAnalyser;
  Executor executor;
  shared_ptr<ExpressionNode> *value;
  RuntimeVariableAnalyser analyser;
  optional<std::reference_wrapper<RuntimeSymbol>_> symbol;
  string name;
  VariableNode *in_stack_fffffffffffffbb8;
  Executor *in_stack_fffffffffffffbc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  undefined7 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1f;
  Context *in_stack_fffffffffffffc20;
  _Storage<std::reference_wrapper<RuntimeSymbol>,_true> __args_1;
  _Map_pointer in_stack_fffffffffffffc28;
  RuntimeFunctionAnalyser local_348;
  undefined1 local_308 [8];
  undefined1 local_300 [184];
  Node *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  RuntimeVariableAnalyser local_c8 [2];
  _Storage<std::reference_wrapper<RuntimeSymbol>,_true> local_40;
  undefined1 local_38;
  
  pCVar5 = (Context *)&stack0xffffffffffffffd0;
  VariableNode::getName_abi_cxx11_(in_stack_fffffffffffffbb8);
  oVar10 = Context::lookup(in_stack_fffffffffffffc20,
                           (string *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
                           (int)((ulong)pCVar5 >> 0x20));
  _Var3 = oVar10.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>._M_payload.
          super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_>._M_payload;
  uVar9 = oVar10.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>._M_payload.
          super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_>._M_engaged;
  __args_1 = _Var3;
  local_40 = _Var3;
  local_38 = uVar9;
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::reference_wrapper<RuntimeSymbol>_> *)0x15d003);
  __flags = _Var3._0_4_;
  if (!bVar1) {
    std::operator+(in_RDI,in_stack_fffffffffffffc00);
    std::operator+(in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0);
    reportError(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  }
  RuntimeVariableAnalyser::RuntimeVariableAnalyser
            ((RuntimeVariableAnalyser *)in_stack_fffffffffffffbc0);
  this_00 = (list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
             *)std::optional<std::reference_wrapper<RuntimeSymbol>_>::value
                         ((optional<std::reference_wrapper<RuntimeSymbol>_> *)
                          in_stack_fffffffffffffbc0);
  pRVar4 = std::reference_wrapper<RuntimeSymbol>::get((reference_wrapper<RuntimeSymbol> *)this_00);
  (*pRVar4->_vptr_RuntimeSymbol[2])(pRVar4,local_c8);
  uVar2 = RuntimeVariableAnalyser::isSymbolValid(local_c8);
  if ((bool)uVar2) {
    this_01 = (Executor *)RuntimeVariableAnalyser::getValue(local_c8);
    pCVar5 = RuntimeVariableAnalyser::getContext((RuntimeVariableAnalyser *)0x15d151);
    Executor(this_01,pCVar5);
    peVar6 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x15d179);
    (*(peVar6->super_Node)._vptr_Node[2])(peVar6,local_300);
    getValue((Executor *)local_300);
    pVVar7 = std::unique_ptr<Value,_std::default_delete<Value>_>::operator->
                       ((unique_ptr<Value,_std::default_delete<Value>_> *)0x15d1ad);
    (*pVVar7->_vptr_Value[2])(local_308);
    std::unique_ptr<Value,_std::default_delete<Value>_>::operator=
              ((unique_ptr<Value,_std::default_delete<Value>_> *)in_stack_fffffffffffffbc0,
               (unique_ptr<Value,_std::default_delete<Value>_> *)in_stack_fffffffffffffbb8);
    std::unique_ptr<Value,_std::default_delete<Value>_>::~unique_ptr
              ((unique_ptr<Value,_std::default_delete<Value>_> *)in_stack_fffffffffffffbc0);
    ~Executor(in_stack_fffffffffffffbc0);
  }
  else {
    RuntimeFunctionAnalyser::RuntimeFunctionAnalyser
              ((RuntimeFunctionAnalyser *)in_stack_fffffffffffffbc0);
    this_02 = std::optional<std::reference_wrapper<RuntimeSymbol>_>::value
                        ((optional<std::reference_wrapper<RuntimeSymbol>_> *)
                         in_stack_fffffffffffffbc0);
    pRVar4 = std::reference_wrapper<RuntimeSymbol>::get(this_02);
    (*pRVar4->_vptr_RuntimeSymbol[2])(pRVar4,&local_348);
    this_03 = (_Optional_payload_base<TypeName>)RuntimeFunctionAnalyser::getReturnType(&local_348);
    __u = (unique_ptr<Function,_std::default_delete<Function>_> *)
          std::optional<TypeName>::value((optional<TypeName> *)in_stack_fffffffffffffbc0);
    in_stack_fffffffffffffbc0 =
         (Executor *)RuntimeFunctionAnalyser::getArguments_abi_cxx11_(&local_348);
    std::__cxx11::
    list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
    ::list(this_00,(list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
                    *)CONCAT17(uVar2,in_stack_fffffffffffffbf8));
    psVar8 = RuntimeFunctionAnalyser::getBody(&local_348);
    std::shared_ptr<BlockNode>::shared_ptr
              ((shared_ptr<BlockNode> *)in_stack_fffffffffffffbc0,psVar8);
    Context::clone((Context *)&stack0xfffffffffffffc28,(__fn *)(in_RDI + 0x10),__child_stack,__flags
                   ,in_R8);
    std::
    make_unique<Function,TypeName_const&,std::__cxx11::list<std::pair<std::__cxx11::string,TypeName>,std::allocator<std::pair<std::__cxx11::string,TypeName>>>const&,std::shared_ptr<BlockNode>const&,Context>
              ((TypeName *)in_stack_fffffffffffffc28,
               (list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
                *)__args_1,(shared_ptr<BlockNode> *)CONCAT17(uVar9,in_stack_fffffffffffffc18),pCVar5
              );
    std::unique_ptr<Value,std::default_delete<Value>>::operator=
              ((unique_ptr<Value,_std::default_delete<Value>_> *)this_03,__u);
    std::unique_ptr<Function,_std::default_delete<Function>_>::~unique_ptr
              ((unique_ptr<Function,_std::default_delete<Function>_> *)in_stack_fffffffffffffbc0);
    Context::~Context((Context *)0x15d377);
    std::shared_ptr<BlockNode>::~shared_ptr((shared_ptr<BlockNode> *)0x15d384);
    std::__cxx11::
    list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
    ::~list((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
             *)0x15d391);
    RuntimeFunctionAnalyser::~RuntimeFunctionAnalyser
              ((RuntimeFunctionAnalyser *)in_stack_fffffffffffffbc0);
  }
  RuntimeVariableAnalyser::~RuntimeVariableAnalyser
            ((RuntimeVariableAnalyser *)in_stack_fffffffffffffbc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void Executor::visit(const VariableNode& node)
{
  const auto name = node.getName();
  const auto symbol = context_.lookup(name);

  if(!symbol)
    reportError("Dereferencing invalid symbol " + name + "!", node);

  RuntimeVariableAnalyser analyser{};
  symbol.value().get().accept(analyser);

  if(analyser.isSymbolValid())
  {
    const auto& value = analyser.getValue();
    auto executor = Executor{analyser.getContext()};

    value->accept(executor);
    value_ = executor.getValue()->clone();
  }
  else
  {
    RuntimeFunctionAnalyser functionAnalyser{};
    symbol.value().get().accept(functionAnalyser);

    const auto returnType = functionAnalyser.getReturnType().value();
    const auto args = functionAnalyser.getArguments();
    const auto body = functionAnalyser.getBody();

    value_ = std::make_unique<Function>(returnType, args, body, context_.clone());
  }
}